

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void enc_clamp_mv(AV1_COMMON *cm,MACROBLOCKD *xd,MV *mv)

{
  long in_RSI;
  long in_RDI;
  SubpelMvLimits mv_limits;
  int px_to_bottom_edge;
  int px_to_top_edge;
  int px_to_right_edge;
  int px_to_left_edge;
  int bh;
  int bw;
  SubpelMvLimits *in_stack_ffffffffffffffb8;
  
  clamp_mv((MV *)CONCAT44(((*(int *)(in_RDI + 0x218) - *(int *)(in_RSI + 4)) * 4 + 4) * 8,
                          (*(int *)(in_RSI + 4) * 4 + (uint)*(byte *)(in_RSI + 0x2074) * 4 + 4) * -8
                         ),in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static inline void enc_clamp_mv(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                MV *mv) {
  int bw = xd->width << MI_SIZE_LOG2;
  int bh = xd->height << MI_SIZE_LOG2;

  int px_to_left_edge = xd->mi_col << MI_SIZE_LOG2;
  int px_to_right_edge = (cm->mi_params.mi_cols - xd->mi_col) << MI_SIZE_LOG2;
  int px_to_top_edge = xd->mi_row << MI_SIZE_LOG2;
  int px_to_bottom_edge = (cm->mi_params.mi_rows - xd->mi_row) << MI_SIZE_LOG2;

  const SubpelMvLimits mv_limits = {
    .col_min = -GET_MV_SUBPEL(px_to_left_edge + bw + AOM_INTERP_EXTEND),
    .col_max = GET_MV_SUBPEL(px_to_right_edge + AOM_INTERP_EXTEND),
    .row_min = -GET_MV_SUBPEL(px_to_top_edge + bh + AOM_INTERP_EXTEND),
    .row_max = GET_MV_SUBPEL(px_to_bottom_edge + AOM_INTERP_EXTEND)
  };
  clamp_mv(mv, &mv_limits);
}